

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O1

ParseDescriptorRequestStruct * __thiscall
cfd::js::api::json::ParseDescriptorRequest::ConvertToStruct
          (ParseDescriptorRequestStruct *__return_storage_ptr__,ParseDescriptorRequest *this)

{
  _Rb_tree_header *p_Var1;
  
  __return_storage_ptr__->is_elements = false;
  (__return_storage_ptr__->descriptor)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->descriptor).field_2;
  (__return_storage_ptr__->descriptor)._M_string_length = 0;
  (__return_storage_ptr__->descriptor).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->network)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->network).field_2;
  *(undefined4 *)&(__return_storage_ptr__->network).field_2 = 0x6e69616d;
  *(undefined4 *)((long)&(__return_storage_ptr__->network).field_2 + 3) = 0x74656e6e;
  (__return_storage_ptr__->network)._M_string_length = 7;
  (__return_storage_ptr__->network).field_2._M_local_buf[7] = '\0';
  (__return_storage_ptr__->bip32_derivation_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->bip32_derivation_path).field_2;
  (__return_storage_ptr__->bip32_derivation_path)._M_string_length = 0;
  (__return_storage_ptr__->bip32_derivation_path).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->is_elements = this->is_elements_;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->descriptor);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->network);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->bip32_derivation_path);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

ParseDescriptorRequestStruct ParseDescriptorRequest::ConvertToStruct() const {  // NOLINT
  ParseDescriptorRequestStruct result;
  result.is_elements = is_elements_;
  result.descriptor = descriptor_;
  result.network = network_;
  result.bip32_derivation_path = bip32_derivation_path_;
  result.ignore_items = ignore_items;
  return result;
}